

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Probe.cpp
# Opt level: O0

void __thiscall helics::apps::Probe::Probe(Probe *this,string_view name,string *configString)

{
  Endpoint *in_RSI;
  undefined8 *in_RDI;
  string *in_stack_000001d8;
  App *in_stack_000001e0;
  undefined1 in_stack_000001e8 [16];
  
  App::App(in_stack_000001e0,(string_view)in_stack_000001e8,in_stack_000001d8);
  *in_RDI = &PTR__Probe_00a47720;
  Endpoint::Endpoint(in_RSI);
  *(undefined4 *)(in_RDI + 0x23) = 0;
  *(undefined4 *)((long)in_RDI + 0x11c) = 0;
  return;
}

Assistant:

Probe::Probe(std::string_view name, const std::string& configString): App(name, configString) {}